

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_disto.c
# Opt level: O3

size_t ReadPicture(char *filename,WebPPicture *pic,int keep_alpha)

{
  int iVar1;
  WebPImageReader p_Var2;
  uint8_t *data;
  size_t data_size;
  uint8_t *local_20;
  size_t local_18;
  
  local_20 = (uint8_t *)0x0;
  local_18 = 0;
  iVar1 = ImgIoUtilReadFile(filename,&local_20,&local_18);
  if (iVar1 != 0) {
    pic->use_argb = 1;
    p_Var2 = WebPGuessImageReader(local_20,local_18);
    iVar1 = (*p_Var2)(local_20,local_18,pic,1,(Metadata *)0x0);
    if (iVar1 != 0) {
      free(local_20);
      return local_18;
    }
  }
  ReadPicture_cold_1();
  return 0;
}

Assistant:

static size_t ReadPicture(const char* const filename, WebPPicture* const pic,
                          int keep_alpha) {
  const uint8_t* data = NULL;
  size_t data_size = 0;
  WebPImageReader reader = NULL;
  int ok = ImgIoUtilReadFile(filename, &data, &data_size);
  if (!ok) goto End;

  pic->use_argb = 1;  // force ARGB

#ifdef HAVE_WINCODEC_H
  // Try to decode the file using WIC falling back to the other readers for
  // e.g., WebP.
  ok = ReadPictureWithWIC(filename, pic, keep_alpha, NULL);
  if (ok) goto End;
#endif
  reader = WebPGuessImageReader(data, data_size);
  ok = reader(data, data_size, pic, keep_alpha, NULL);

 End:
  if (!ok) {
    WFPRINTF(stderr, "Error! Could not process file %s\n",
             (const W_CHAR*)filename);
  }
  free((void*)data);
  return ok ? data_size : 0;
}